

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpatexpress.hh
# Opt level: O3

void __thiscall ContextField::ContextField(ContextField *this,bool s,int4 sbit,int4 ebit)

{
  uint uVar1;
  
  *(undefined4 *)&this->field_0x8 = 0;
  *(undefined ***)this = &PTR__PatternExpression_003cd590;
  this->signbit = s;
  this->startbit = sbit;
  this->endbit = ebit;
  this->startbyte = (int)(((uint)(sbit >> 0x1f) >> 0x1d) + sbit) >> 3;
  this->endbyte = (int)(((uint)(ebit >> 0x1f) >> 0x1d) + ebit) >> 3;
  uVar1 = ebit + 7;
  if (-1 < ebit) {
    uVar1 = ebit;
  }
  this->shift = ((uVar1 & 0xfffffff8) - ebit) + 7;
  return;
}

Assistant:

PatternExpression(void) { refcount = 0; }